

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT-common.h
# Opt level: O2

void do_recursion(w128_t *r,w128_t *a,w128_t *b,w128_t *lung)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = a->u[0];
  uVar2 = a->u[1];
  uVar3 = lung->u[0];
  uVar4 = lung->u[1] << 0x20 ^ lung->u[1] >> 0x20 ^ uVar1 << 0x13 ^ b->u[0];
  lung->u[0] = uVar4;
  lung->u[1] = uVar3 << 0x20 ^ uVar3 >> 0x20 ^ uVar2 << 0x13 ^ b->u[1];
  r->u[0] = uVar4 & 0xffafffffffb3f ^ uVar4 >> 0xc ^ uVar1;
  r->u[1] = lung->u[1] & 0xffdfffc90fffd ^ lung->u[1] >> 0xc ^ uVar2;
  return;
}

Assistant:

inline static void do_recursion(w128_t *r, w128_t *a, w128_t * b,
                                w128_t *lung) {
    uint64_t t0, t1, L0, L1;

    t0 = a->u[0];
    t1 = a->u[1];
    L0 = lung->u[0];
    L1 = lung->u[1];
    lung->u[0] = (t0 << DSFMT_SL1) ^ (L1 >> 32) ^ (L1 << 32) ^ b->u[0];
    lung->u[1] = (t1 << DSFMT_SL1) ^ (L0 >> 32) ^ (L0 << 32) ^ b->u[1];
    r->u[0] = (lung->u[0] >> DSFMT_SR) ^ (lung->u[0] & DSFMT_MSK1) ^ t0;
    r->u[1] = (lung->u[1] >> DSFMT_SR) ^ (lung->u[1] & DSFMT_MSK2) ^ t1;
}